

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  uint8 *puVar1;
  int *piVar2;
  float fVar3;
  uint8 uVar4;
  ushort uVar5;
  ushort uVar6;
  vector<unsigned_short> *remapping;
  level_details *plVar7;
  endpoint_indices_details *peVar8;
  bool bVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  uint16 i;
  unsigned_short uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  uint16 i_2;
  uint min_new_capacity;
  uint uVar20;
  byte bVar21;
  ulong uVar22;
  vector<unsigned_char> *packed_data;
  byte bVar23;
  ulong uVar24;
  uint8 uVar25;
  int iVar26;
  ulong uVar27;
  uint i_1;
  byte bVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  crn_comp *this_00;
  uint uVar32;
  bool bVar33;
  static_huffman_data_model dm;
  vector<unsigned_int> hist;
  symbol_codec codec;
  byte local_1ae;
  byte local_1ad;
  byte local_1ac;
  byte local_1ab;
  byte local_1aa;
  byte local_1a9;
  ushort local_1a8;
  byte local_1a6;
  byte local_1a5;
  byte local_1a4;
  byte local_1a3;
  byte local_1a2;
  byte local_1a1;
  uint local_18c;
  ulong local_178;
  void *local_148;
  unsigned_short *puStack_140;
  uchar *local_130;
  uint local_128;
  elemental_vector local_108;
  crn_comp *local_f0;
  long local_e8;
  unsigned_short *local_e0;
  ulong local_d8;
  ulong local_d0;
  symbol_codec local_c8;
  
  remapping = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar16 = (ulong)uVar5;
  uVar15 = remapping->m_size;
  if (uVar15 != uVar5) {
    if (uVar15 <= uVar5) {
      uVar14 = (uint)uVar5;
      if (remapping->m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar14,uVar15 + 1 == uVar14,2,(object_mover)0x0,
                   false);
      }
      memset(remapping->m_p + remapping->m_size,0,(ulong)(uVar14 - remapping->m_size) * 2);
    }
    remapping->m_size = (uint)uVar5;
  }
  local_f0 = this;
  if (data == 0) {
    lVar31 = *pData_ptr;
    uVar15 = remapping->m_size;
    uVar14 = (uint)uVar5;
    if (uVar15 != uVar14) {
      if (uVar15 <= uVar14) {
        if (remapping->m_capacity < uVar14) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)remapping,uVar14,uVar15 + 1 == uVar14,2,(object_mover)0x0,
                     false);
        }
        memset(remapping->m_p + remapping->m_size,0,(ulong)(uVar14 - remapping->m_size) * 2);
      }
      remapping->m_size = uVar14;
    }
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar16 == 0) {
      local_148 = (void *)0x0;
      puStack_140 = (unsigned_short *)0x0;
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,(uint)uVar5,uVar14 == 1,8,
                 vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,(uint)uVar5)
      ;
      local_148 = (void *)0x0;
      puStack_140 = (unsigned_short *)0x0;
      uVar15 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar15,uVar14 == 1,2,(object_mover)0x0,false);
      memset((void *)(((ulong)puStack_140 & 0xffffffff) * 2 + (long)local_148),0,
             (ulong)(uVar15 - (uint)puStack_140) * 2);
      puStack_140 = (unsigned_short *)CONCAT44(puStack_140._4_4_,uVar15);
      uVar17 = 0;
      do {
        local_c8.m_pDecode_buf[uVar17 * 8] = *(uint8 *)(lVar31 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 1] = *(uint8 *)(lVar31 + 1 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 2] = *(uint8 *)(lVar31 + 2 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 3] = *(uint8 *)(lVar31 + 3 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 4] = *(uint8 *)(lVar31 + 4 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 5] = *(uint8 *)(lVar31 + 5 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 6] = *(uint8 *)(lVar31 + 6 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 7] = *(uint8 *)(lVar31 + 7 + uVar17 * 8);
        *(short *)((long)local_148 + uVar17 * 2) = (short)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
      bVar19 = 0;
      bVar21 = 0;
      bVar23 = 0;
      uVar15 = 0;
      uVar14 = 0;
      bVar28 = 0;
      uVar17 = uVar16;
      do {
        uVar29 = 0xffffffff;
        uVar18 = 0;
        uVar20 = 0;
        do {
          uVar32 = ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 6] - (uint)bVar28) *
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 6] - (uint)bVar28) +
                   (local_c8.m_pDecode_buf[uVar18 * 8 + 5] - uVar14) *
                   (local_c8.m_pDecode_buf[uVar18 * 8 + 5] - uVar14) +
                   (local_c8.m_pDecode_buf[uVar18 * 8 + 4] - uVar15) *
                   (local_c8.m_pDecode_buf[uVar18 * 8 + 4] - uVar15) +
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 2] - (uint)bVar23) *
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 2] - (uint)bVar23) +
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 1] - (uint)bVar21) *
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8 + 1] - (uint)bVar21) +
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8] - (uint)bVar19) *
                   ((uint)local_c8.m_pDecode_buf[uVar18 * 8] - (uint)bVar19);
          if (uVar32 < uVar29) {
            uVar29 = uVar32;
            uVar20 = (uint)uVar18;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < uVar17);
        uVar18 = (ulong)((uVar20 & 0xffff) * 8);
        bVar19 = local_c8.m_pDecode_buf[uVar18];
        bVar21 = local_c8.m_pDecode_buf[uVar18 + 1];
        bVar23 = local_c8.m_pDecode_buf[uVar18 + 2];
        uVar15 = (uint)local_c8.m_pDecode_buf[uVar18 + 4];
        uVar14 = (uint)local_c8.m_pDecode_buf[uVar18 + 5];
        bVar28 = local_c8.m_pDecode_buf[uVar18 + 6];
        uVar22 = (ulong)((uVar20 & 0xffff) * 2);
        remapping->m_p[*(ushort *)((long)local_148 + uVar22)] = uVar5 - (short)uVar17;
        local_c8.m_pDecode_buf[uVar18] = local_c8.m_pDecode_buf[uVar17 * 8 + -8];
        local_c8.m_pDecode_buf[uVar18 + 1] = local_c8.m_pDecode_buf[uVar17 * 8 + -7];
        local_c8.m_pDecode_buf[uVar18 + 2] = local_c8.m_pDecode_buf[uVar17 * 8 + -6];
        local_c8.m_pDecode_buf[uVar18 + 3] = local_c8.m_pDecode_buf[uVar17 * 8 + -5];
        local_c8.m_pDecode_buf[uVar18 + 4] = local_c8.m_pDecode_buf[uVar17 * 8 + -4];
        local_c8.m_pDecode_buf[uVar18 + 5] = local_c8.m_pDecode_buf[uVar17 * 8 + -3];
        local_c8.m_pDecode_buf[uVar18 + 6] = local_c8.m_pDecode_buf[uVar17 * 8 + -2];
        local_c8.m_pDecode_buf[uVar18 + 7] = local_c8.m_pDecode_buf[uVar17 * 8 + -1];
        *(undefined2 *)((long)local_148 + uVar22) =
             *(undefined2 *)((long)local_148 + uVar17 * 2 + -2);
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    if (local_148 != (void *)0x0) {
      crnlib_free(local_148);
    }
    this_00 = local_f0;
    if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
      crnlib_free(local_c8.m_pDecode_buf);
    }
    optimize_color_selectors(this_00);
  }
  else {
    local_e0 = remapping->m_p;
    lVar31 = *pData_ptr;
    local_e8 = *(long *)((long)pData_ptr + 8);
    local_1a8 = *(ushort *)((long)pData_ptr + 0x12);
    fVar3 = *(float *)((long)pData_ptr + 0x14);
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    uVar14 = (uint)uVar5;
    uVar15 = (uint)uVar5;
    if (uVar16 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,uVar15,uVar15 == 1,0x18,vector<Node>::object_mover,
                 false);
      if (uVar14 != (uint)local_c8.m_pDecode_buf_next) {
        memset(local_c8.m_pDecode_buf + ((ulong)local_c8.m_pDecode_buf_next & 0xffffffff) * 0x18,0,
               (((ulong)(uVar15 - (uint)local_c8.m_pDecode_buf_next) * 0x18 - 0x18) / 0x18) * 0x18 +
               0x18);
      }
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,uVar14);
      lVar12 = 0;
      uVar17 = 0;
      do {
        *(int *)(local_c8.m_pDecode_buf + lVar12) = (int)uVar17;
        local_c8.m_pDecode_buf[lVar12 + 0x10] = *(uint8 *)(lVar31 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x11] = *(uint8 *)(lVar31 + 1 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x12] = *(uint8 *)(lVar31 + 2 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x13] = *(uint8 *)(lVar31 + 3 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x14] = *(uint8 *)(lVar31 + 4 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x15] = *(uint8 *)(lVar31 + 5 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x16] = *(uint8 *)(lVar31 + 6 + uVar17 * 8);
        local_c8.m_pDecode_buf[lVar12 + 0x17] = *(uint8 *)(lVar31 + 7 + uVar17 * 8);
        uVar17 = uVar17 + 1;
        lVar12 = lVar12 + 0x18;
      } while (uVar16 != uVar17);
    }
    local_148 = (void *)0x0;
    puStack_140 = (unsigned_short *)0x0;
    if (uVar16 != 0) {
      min_new_capacity = uVar15 * 2;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,min_new_capacity,false,2,(object_mover)0x0,false);
      memset((void *)(((ulong)puStack_140 & 0xffffffff) * 2 + (long)local_148),0,
             (ulong)(min_new_capacity - (uint)puStack_140) * 2);
      puStack_140 = (unsigned_short *)CONCAT44(puStack_140._4_4_,min_new_capacity);
    }
    this_00 = local_f0;
    uVar17 = (ulong)local_1a8;
    *(ushort *)((long)local_148 + uVar16 * 2) = local_1a8;
    local_1a9 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x10];
    local_1aa = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x11];
    local_1ab = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x12];
    local_1ac = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x14];
    local_1ad = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x15];
    local_1ae = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x16];
    local_178 = (ulong)(uVar14 - 1);
    uVar10 = *(undefined8 *)(local_c8.m_pDecode_buf + local_178 * 0x18 + 8);
    *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18) =
         *(undefined8 *)(local_c8.m_pDecode_buf + local_178 * 0x18);
    *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18 + 8) = uVar10;
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x10] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x10];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x11] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x11];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x12] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x12];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x13] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x13];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x14] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x14];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x15] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x15];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x16] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x16];
    local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x17] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x17];
    uVar17 = uVar16;
    uVar18 = uVar16;
    if (uVar14 - 1 != 0) {
      uVar22 = (ulong)(local_1a8 * uVar14);
      bVar33 = true;
      iVar11 = 0;
      bVar9 = true;
      local_1a6 = local_1ae;
      local_1a5 = local_1ad;
      local_1a4 = local_1ac;
      local_1a3 = local_1ab;
      local_1a2 = local_1aa;
      local_1a1 = local_1a9;
      do {
        local_d8 = uVar18;
        local_d0 = uVar17;
        lVar31 = 0x16;
        uVar17 = 0;
        local_18c = 0;
        uVar15 = 0;
        do {
          *(int *)(local_c8.m_pDecode_buf + lVar31 + -0x12) =
               *(int *)(local_c8.m_pDecode_buf + lVar31 + -0x12) +
               *(int *)(local_e8 + uVar22 * 4 +
                       (ulong)*(uint *)(local_c8.m_pDecode_buf + lVar31 + -0x16) * 4);
          iVar26 = (int)(long)(fVar3 * 4000.0 + 4000.0);
          if (bVar9) {
            uVar14 = ((uint)local_c8.m_pDecode_buf[lVar31] - (uint)local_1a6) *
                     ((uint)local_c8.m_pDecode_buf[lVar31] - (uint)local_1a6) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -1] - (uint)local_1a5) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -1] - (uint)local_1a5) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -2] - (uint)local_1a4) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -2] - (uint)local_1a4) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -4] - (uint)local_1a3) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -4] - (uint)local_1a3) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -5] - (uint)local_1a2) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -5] - (uint)local_1a2) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -6] - (uint)local_1a1) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -6] - (uint)local_1a1);
            if (3999 < uVar14) {
              uVar14 = 4000;
            }
            *(uint *)(local_c8.m_pDecode_buf + lVar31 + -0xe) = iVar26 - uVar14;
          }
          if (bVar33) {
            uVar14 = ((uint)local_c8.m_pDecode_buf[lVar31] - (uint)local_1ae) *
                     ((uint)local_c8.m_pDecode_buf[lVar31] - (uint)local_1ae) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -1] - (uint)local_1ad) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -1] - (uint)local_1ad) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -2] - (uint)local_1ac) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -2] - (uint)local_1ac) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -4] - (uint)local_1ab) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -4] - (uint)local_1ab) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -5] - (uint)local_1aa) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -5] - (uint)local_1aa) +
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -6] - (uint)local_1a9) *
                     ((uint)local_c8.m_pDecode_buf[lVar31 + -6] - (uint)local_1a9);
            if (3999 < uVar14) {
              uVar14 = 4000;
            }
            *(uint *)(local_c8.m_pDecode_buf + lVar31 + -10) = iVar26 - uVar14;
          }
          uVar14 = *(uint *)(local_c8.m_pDecode_buf + lVar31 + -10);
          if (*(uint *)(local_c8.m_pDecode_buf + lVar31 + -10) <
              *(uint *)(local_c8.m_pDecode_buf + lVar31 + -0xe)) {
            uVar14 = *(uint *)(local_c8.m_pDecode_buf + lVar31 + -0xe);
          }
          uVar14 = (*(int *)(local_c8.m_pDecode_buf + lVar31 + -0x12) + iVar11) * uVar14 + 1;
          if ((uVar15 < uVar14) ||
             ((uVar15 == uVar14 &&
              (*(uint *)(local_c8.m_pDecode_buf + lVar31 + -0x16) < (uint)local_1a8)))) {
            local_1a8 = *(ushort *)(local_c8.m_pDecode_buf + lVar31 + -0x16);
            local_18c = (uint)uVar17;
            uVar15 = uVar14;
          }
          uVar17 = uVar17 + 1;
          lVar31 = lVar31 + 0x18;
        } while (local_178 != uVar17);
        uVar22 = (ulong)((uint)local_1a8 * (uint)uVar5);
        iVar26 = (int)local_d0;
        iVar30 = (int)local_d8;
        if (iVar26 - iVar30 == 0 || iVar26 < iVar30) {
          uVar24 = 0;
          uVar27 = 0;
        }
        else {
          lVar31 = local_e8 + uVar22 * 4;
          uVar15 = 0;
          uVar14 = 0;
          uVar17 = local_d0;
          uVar18 = local_d8;
          iVar11 = iVar26 - iVar30;
          do {
            uVar14 = uVar14 + *(int *)(lVar31 + (ulong)*(ushort *)((long)local_148 + uVar18 * 2) * 4
                                      ) * iVar11;
            uVar15 = uVar15 + *(int *)(lVar31 + (ulong)*(ushort *)((long)local_148 + uVar17 * 2) * 4
                                      ) * iVar11;
            uVar18 = (ulong)((int)uVar18 + 1);
            uVar17 = (ulong)((int)uVar17 - 1);
            bVar33 = 2 < iVar11;
            iVar11 = iVar11 + -2;
          } while (bVar33);
          uVar24 = (ulong)uVar14;
          uVar27 = (ulong)uVar15;
        }
        puVar1 = local_c8.m_pDecode_buf + (ulong)local_18c * 0x18;
        iVar11 = *(int *)(puVar1 + 4);
        uVar24 = *(uint *)(puVar1 + 8) * uVar24;
        uVar27 = *(uint *)(puVar1 + 0xc) * uVar27;
        bVar33 = uVar24 - uVar27 == 0;
        bVar9 = uVar24 >= uVar27 && !bVar33;
        if (uVar24 < uVar27 || bVar33) {
          uVar17 = (ulong)(iVar26 + 1);
          *(ushort *)((long)local_148 + uVar17 * 2) = local_1a8;
          local_1a9 = puVar1[0x10];
          local_1aa = puVar1[0x11];
          local_1ab = puVar1[0x12];
          local_1ac = puVar1[0x14];
          local_1ad = puVar1[0x15];
          local_1ae = puVar1[0x16];
          uVar18 = local_d8;
        }
        else {
          *(ushort *)((long)local_148 + (ulong)(iVar30 - 1) * 2) = local_1a8;
          local_1a1 = puVar1[0x10];
          local_1a2 = puVar1[0x11];
          local_1a3 = puVar1[0x12];
          local_1a4 = puVar1[0x14];
          local_1a5 = puVar1[0x15];
          local_1a6 = puVar1[0x16];
          uVar17 = local_d0;
          uVar18 = (ulong)(iVar30 - 1);
        }
        iVar11 = iVar11 << 3;
        bVar33 = uVar24 < uVar27 || uVar24 - uVar27 == 0;
        local_178 = local_178 - 1;
        uVar10 = *(undefined8 *)(local_c8.m_pDecode_buf + local_178 * 0x18 + 8);
        *(undefined8 *)puVar1 = *(undefined8 *)(local_c8.m_pDecode_buf + local_178 * 0x18);
        *(undefined8 *)(puVar1 + 8) = uVar10;
        puVar1[0x10] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x10];
        puVar1[0x11] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x11];
        puVar1[0x12] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x12];
        puVar1[0x13] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x13];
        puVar1[0x14] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x14];
        puVar1[0x15] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x15];
        puVar1[0x16] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x16];
        puVar1[0x17] = local_c8.m_pDecode_buf[local_178 * 0x18 + 0x17];
      } while (local_178 != 0);
    }
    if (((uint)uVar18 & 0xffff) <= (uint)uVar17) {
      uVar13 = 0;
      do {
        local_e0[*(ushort *)((long)local_148 + (uVar18 & 0xffff) * 2)] = uVar13;
        uVar15 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar15;
        uVar13 = uVar13 + 1;
      } while ((uVar15 & 0xffff) <= (uint)uVar17);
    }
    if (local_148 != (void *)0x0) {
      crnlib_free(local_148);
    }
    if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
      crnlib_free(local_c8.m_pDecode_buf);
    }
  }
  packed_data = (vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10);
  if (this_00->m_has_etc_color_blocks == true) {
    pack_color_endpoints_etc(this_00,packed_data,remapping);
  }
  else {
    pack_color_endpoints(this_00,packed_data,remapping);
  }
  iVar11 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  if (uVar16 != 0) {
    elemental_vector::increase_capacity(&local_108,(uint)uVar5,uVar5 == 1,4,(object_mover)0x0,false)
    ;
    memset((void *)((local_108._8_8_ & 0xffffffff) * 4 + (long)local_108.m_p),0,
           (ulong)(uVar5 - local_108.m_size) << 2);
    local_108.m_size = (uint)uVar5;
  }
  if ((this_00->m_levels).m_size != 0) {
    uVar17 = 0;
    do {
      plVar7 = (this_00->m_levels).m_p;
      uVar15 = plVar7[uVar17].first_block;
      uVar18 = (ulong)uVar15;
      uVar14 = plVar7[uVar17].num_blocks + uVar15;
      if (uVar15 < uVar14) {
        uVar15 = 0;
        do {
          peVar8 = (this_00->m_endpoint_indices).m_p;
          uVar6 = remapping->m_p[peVar8[uVar18].field_0.field_0.color];
          uVar4 = peVar8[uVar18].reference;
          uVar25 = uVar4;
          if (this_00->m_has_subblocks == false) {
            uVar25 = uVar4 == '\0';
          }
          if ((uVar18 & 1) == 0) {
            uVar25 = uVar4 == '\0';
          }
          if (uVar25 != '\0') {
            iVar26 = uVar6 - uVar15;
            piVar2 = (int *)((long)local_108.m_p +
                            (ulong)((iVar26 >> 0x1f & (uint)uVar5) + iVar26) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar18 = uVar18 + 1;
          uVar15 = (uint)uVar6;
        } while (uVar14 != uVar18);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (this_00->m_levels).m_size);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_148);
  static_huffman_data_model::init((static_huffman_data_model *)&local_148,(EVP_PKEY_CTX *)0x1);
  if (local_128 == 0) {
    local_130 = (uchar *)0x0;
  }
  iVar11 = iVar11 << 3;
  if (uVar16 != 0) {
    uVar17 = 0;
    do {
      iVar11 = iVar11 + (uint)local_130[uVar17] * *(int *)((long)local_108.m_p + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x10000);
  local_c8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,(static_huffman_data_model *)&local_148,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_c8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar11 + local_c8.m_total_bits_written;
  if (pData_ptr != (void *)0x0) {
    crnlib_free(pData_ptr);
  }
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_148);
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_color_selectors();
  }

  m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      uint index = remapping[m_endpoint_indices[b].component[cColor]];
      if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) {
        int sym = index - endpoint_index;
        hist[sym < 0 ? sym + n : sym]++;
      }
      endpoint_index = index;
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}